

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDwaCompressor.cpp
# Opt level: O3

void __thiscall
Imf_3_2::DwaCompressor::LossyDctEncoderBase::LossyDctEncoderBase
          (LossyDctEncoderBase *this,float quantBaseError,char *packedAc,char *packedDc,
          unsigned_short *toNonlinear,int width,int height)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  long lVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  
  this->_vptr_LossyDctEncoderBase = (_func_int **)&PTR__LossyDctEncoderBase_003d6620;
  this->_quantBaseError = quantBaseError;
  this->_width = width;
  this->_height = height;
  this->_toNonlinear = toNonlinear;
  this->_numAcComp = 0;
  this->_numDcComp = 0;
  (this->_rowPtrs).
  super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_rowPtrs).
  super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_rowPtrs).
  super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_type).super__Vector_base<Imf_3_2::PixelType,_std::allocator<Imf_3_2::PixelType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_type).super__Vector_base<Imf_3_2::PixelType,_std::allocator<Imf_3_2::PixelType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_type).super__Vector_base<Imf_3_2::PixelType,_std::allocator<Imf_3_2::PixelType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_dctData).
  super__Vector_base<Imf_3_2::SimdAlignedBuffer64<float>,_std::allocator<Imf_3_2::SimdAlignedBuffer64<float>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_dctData).
  super__Vector_base<Imf_3_2::SimdAlignedBuffer64<float>,_std::allocator<Imf_3_2::SimdAlignedBuffer64<float>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_dctData).
  super__Vector_base<Imf_3_2::SimdAlignedBuffer64<float>,_std::allocator<Imf_3_2::SimdAlignedBuffer64<float>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->_packedAc = packedAc;
  this->_packedDc = packedDc;
  auVar2 = _DAT_00204ec0;
  auVar1 = _DAT_00204eb0;
  lVar3 = 0;
  do {
    auVar4._0_4_ = (float)*(int *)(&DAT_002252c0 + lVar3);
    auVar4._4_4_ = (float)*(int *)(&UNK_002252c4 + lVar3);
    auVar4._8_4_ = (float)*(int *)(&UNK_002252c8 + lVar3);
    auVar4._12_4_ = (float)*(int *)(&UNK_002252cc + lVar3);
    auVar4 = divps(auVar4,auVar1);
    *(undefined1 (*) [16])((long)this->_quantTableY + lVar3) = auVar4;
    auVar5._0_4_ = (float)*(int *)(&DAT_002253c0 + lVar3);
    auVar5._4_4_ = (float)*(int *)(&UNK_002253c4 + lVar3);
    auVar5._8_4_ = (float)*(int *)(&UNK_002253c8 + lVar3);
    auVar5._12_4_ = (float)*(int *)(&UNK_002253cc + lVar3);
    auVar4 = divps(auVar5,auVar2);
    *(undefined1 (*) [16])((long)this->_quantTableCbCr + lVar3) = auVar4;
    lVar3 = lVar3 + 0x10;
  } while (lVar3 != 0x100);
  return;
}

Assistant:

DwaCompressor::LossyDctEncoderBase::LossyDctEncoderBase (
    float                 quantBaseError,
    char*                 packedAc,
    char*                 packedDc,
    const unsigned short* toNonlinear,
    int                   width,
    int                   height)
    : _quantBaseError (quantBaseError)
    , _width (width)
    , _height (height)
    , _toNonlinear (toNonlinear)
    , _numAcComp (0)
    , _numDcComp (0)
    , _packedAc (packedAc)
    , _packedDc (packedDc)
{
    //
    // Here, we take the generic JPEG quantization tables and
    // normalize them by the smallest component in each table.
    // This gives us a relationship amongst the DCT components,
    // in terms of how sensitive each component is to
    // error.
    //
    // A higher normalized value means we can quantize more,
    // and a small normalized value means we can quantize less.
    //
    // Eventually, we will want an acceptable quantization
    // error range for each component. We find this by
    // multiplying some user-specified level (_quantBaseError)
    // by the normalized table (_quantTableY, _quantTableCbCr) to
    // find the acceptable quantization error range.
    //
    // The quantization table is not needed for decoding, and
    // is not transmitted. So, if you want to get really fancy,
    // you could derive some content-dependent quantization
    // table, and the decoder would not need to be changed. But,
    // for now, we'll just use statice quantization tables.
    //

    int jpegQuantTableY[] = {
        16, 11, 10, 16, 24,  40,  51,  61,  12, 12, 14, 19, 26,  58,  60,  55,
        14, 13, 16, 24, 40,  57,  69,  56,  14, 17, 22, 29, 51,  87,  80,  62,
        18, 22, 37, 56, 68,  109, 103, 77,  24, 35, 55, 64, 81,  104, 113, 92,
        49, 64, 78, 87, 103, 121, 120, 101, 72, 92, 95, 98, 112, 100, 103, 99};

    int jpegQuantTableYMin = 10;

    int jpegQuantTableCbCr[] = {
        17, 18, 24, 47, 99, 99, 99, 99, 18, 21, 26, 66, 99, 99, 99, 99,
        24, 26, 56, 99, 99, 99, 99, 99, 47, 66, 99, 99, 99, 99, 99, 99,
        99, 99, 99, 99, 99, 99, 99, 99, 99, 99, 99, 99, 99, 99, 99, 99,
        99, 99, 99, 99, 99, 99, 99, 99, 99, 99, 99, 99, 99, 99, 99, 99};

    int jpegQuantTableCbCrMin = 17;

    for (int idx = 0; idx < 64; ++idx)
    {
        _quantTableY[idx] = static_cast<float> (jpegQuantTableY[idx]) /
                            static_cast<float> (jpegQuantTableYMin);

        _quantTableCbCr[idx] = static_cast<float> (jpegQuantTableCbCr[idx]) /
                               static_cast<float> (jpegQuantTableCbCrMin);
    }

    if (_quantBaseError < 0) quantBaseError = 0;
}